

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O0

void __thiscall CFG::cleanUp(CFG *this)

{
  ostream *poVar1;
  CFG *this_local;
  
  eliminateEpsilonProductions(this);
  poVar1 = std::operator<<((ostream *)&std::cout,"Eliminated epsilon productions: ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  printReadable(this);
  eliminateUnitProductions(this);
  poVar1 = std::operator<<((ostream *)&std::cout,"Eliminated unit productions: ");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  printReadable(this);
  eliminateUselessSymbols(this);
  return;
}

Assistant:

void CFG::cleanUp() {
    eliminateEpsilonProductions();

    std::cout << "Eliminated epsilon productions: " << std::endl;
    printReadable();

    eliminateUnitProductions();

    std::cout << "Eliminated unit productions: " << std::endl;
    printReadable();

    eliminateUselessSymbols();
}